

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringCacheTest.cpp
# Opt level: O1

void __thiscall
TEST_SimpleStringInternalCache_multipleDifferentSizeAllocationsAndDeallocations_Test::
TEST_SimpleStringInternalCache_multipleDifferentSizeAllocationsAndDeallocations_Test
          (TEST_SimpleStringInternalCache_multipleDifferentSizeAllocationsAndDeallocations_Test
           *this)

{
  memset(this,0,0xa0);
  Utest::Utest((Utest *)this);
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupSimpleStringInternalCache_00370b30;
  SimpleStringInternalCache::SimpleStringInternalCache
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).cache);
  MemoryAccountant::MemoryAccountant
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).accountant);
  ExecFunction::ExecFunction
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).testFunction.
              super_ExecFunction);
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).testFunction.super_ExecFunction.
  _vptr_ExecFunction = (_func_int **)&PTR__ExecFunctionWithoutParameters_00370b70;
  TestTestingFixture::TestTestingFixture
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).fixture);
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupSimpleStringInternalCache_00370448;
  return;
}

Assistant:

TEST(SimpleStringInternalCache, multipleDifferentSizeAllocationsAndDeallocations)
{
    cache.setAllocator(allocator);

    char* mem10 = cache.alloc(10);
    char* mem11 = cache.alloc(11);

    char* mem100 = cache.alloc(100);
    cache.dealloc(mem100, 100);

    char* mem101 = cache.alloc(101);
    char* mem102 = cache.alloc(102);
    char* mem103 = cache.alloc(103);
    cache.dealloc(mem101, 102);
    cache.dealloc(mem102, 103);
    cache.dealloc(mem103, 104);

    cache.alloc(105);
    cache.alloc(106);
    cache.alloc(107);

    cache.dealloc(mem10, 10);
    cache.dealloc(mem11, 11);

    LONGS_EQUAL(2, accountant.totalAllocationsOfSize(32));
    LONGS_EQUAL(3, accountant.totalAllocationsOfSize(128));
}